

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::DipoleField::getValue(DipoleField *this,StuntDouble *sd)

{
  bool bVar1;
  StuntDouble *in_RDX;
  StuntDouble *in_RDI;
  RealType RVar2;
  Vector3d pos;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  AtomType *atomType;
  RealType charge;
  AtomIterator ai;
  Atom *atom;
  RigidBody *rb;
  RealType eAtoDebye;
  Vector3d *dipoleVector;
  Vector<double,_3U> *in_stack_fffffffffffffef8;
  StuntDouble *this_00;
  iterator *in_stack_ffffffffffffff18;
  RigidBody *in_stack_ffffffffffffff20;
  FluctuatingChargeAdapter local_90;
  FixedChargeAdapter local_88;
  AtomType *local_80;
  RealType local_78;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_70;
  Atom *local_68;
  StuntDouble *local_60;
  double local_40;
  Vector<double,_3U> local_38;
  undefined8 local_20;
  StuntDouble *local_18;
  
  local_20 = 0x4013367b4088c94c;
  local_40 = 0.0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  Vector<double,_3U>::Vector(&local_38,&local_40);
  Vector3<double>::Vector3((Vector3<double> *)in_RDI,in_stack_fffffffffffffef8);
  bVar1 = StuntDouble::isDirectionalAtom(local_18);
  if (bVar1) {
    StuntDouble::getDipole(this_00);
    Vector<double,_3U>::operator+=((Vector<double,_3U> *)in_RDI,in_stack_fffffffffffffef8);
  }
  bVar1 = StuntDouble::isRigidBody(local_18);
  if (bVar1) {
    local_60 = local_18;
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_70);
    local_68 = RigidBody::beginAtom(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    while (local_68 != (Atom *)0x0) {
      local_78 = 0.0;
      local_80 = Atom::getAtomType(local_68);
      FixedChargeAdapter::FixedChargeAdapter(&local_88,local_80);
      bVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x172f2c);
      if (bVar1) {
        local_78 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_RDI);
      }
      FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_90,local_80);
      bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x172f64);
      if (bVar1) {
        RVar2 = StuntDouble::getFlucQPos(in_RDI);
        local_78 = RVar2 + local_78;
      }
      StuntDouble::getPos(this_00);
      OpenMD::operator*((Vector<double,_3U> *)this_00,(double)in_RDI);
      OpenMD::operator*((Vector<double,_3U> *)this_00,(double)in_RDI);
      Vector<double,_3U>::operator+=((Vector<double,_3U> *)in_RDI,in_stack_fffffffffffffef8);
      bVar1 = Atom::isDipole((Atom *)0x172fe6);
      if (bVar1) {
        StuntDouble::getDipole(this_00);
        Vector<double,_3U>::operator+=((Vector<double,_3U> *)in_RDI,in_stack_fffffffffffffef8);
      }
      local_68 = RigidBody::nextAtom(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
  }
  return (Vector3d *)in_RDI;
}

Assistant:

Vector3d DipoleField::getValue(StuntDouble* sd) {
    const RealType eAtoDebye = 4.8032045444;
    Vector3d dipoleVector(0.0);

    if (sd->isDirectionalAtom()) {
      dipoleVector += static_cast<DirectionalAtom*>(sd)->getDipole();
    }

    if (sd->isRigidBody()) {
      RigidBody* rb = static_cast<RigidBody*>(sd);
      Atom* atom;
      RigidBody::AtomIterator ai;
      for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
        RealType charge(0.0);
        AtomType* atomType = atom->getAtomType();

        FixedChargeAdapter fca = FixedChargeAdapter(atomType);
        if (fca.isFixedCharge()) { charge = fca.getCharge(); }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }

        Vector3d pos = atom->getPos();
        dipoleVector += pos * charge * eAtoDebye;

        if (atom->isDipole()) { dipoleVector += atom->getDipole(); }
      }
    }
    return dipoleVector;
  }